

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

void __thiscall FIX::FieldMap::removeGroup(FieldMap *this,int num,int tag)

{
  FieldMap *pFVar1;
  iterator __position;
  ulong uVar2;
  const_iterator __position_00;
  int tag_local;
  IntField groupCount;
  
  tag_local = tag;
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
               ::find(&(this->m_groups)._M_t,&tag_local);
  if (0 < num &&
      (_Rb_tree_header *)__position._M_node != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header)
  {
    if ((ulong)(uint)num <=
        (ulong)((long)__position._M_node[1]._M_left - (long)__position._M_node[1]._M_parent >> 3)) {
      __position_00._M_current =
           (FieldMap **)((long)__position._M_node[1]._M_parent + (ulong)(uint)num * 8 + -8);
      pFVar1 = *__position_00._M_current;
      if (pFVar1 != (FieldMap *)0x0) {
        (*pFVar1->_vptr_FieldMap[1])();
      }
      std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::erase
                ((vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *)
                 &__position._M_node[1]._M_parent,__position_00);
      uVar2 = (long)__position._M_node[1]._M_left - (long)__position._M_node[1]._M_parent;
      if (uVar2 == 0) {
        std::
        _Rb_tree<int,std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,std::_Select1st<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
        ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,std::_Select1st<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
                            *)&this->m_groups,__position);
        removeField(this,tag_local);
      }
      else {
        IntField::IntField((IntField *)&groupCount.super_FieldBase,tag_local,(int)(uVar2 >> 3));
        setField(this,&groupCount.super_FieldBase,true);
        FieldBase::~FieldBase(&groupCount.super_FieldBase);
      }
    }
  }
  return;
}

Assistant:

void FieldMap::removeGroup(int num, int tag) {
  Groups::iterator tagWithGroups = m_groups.find(tag);
  if (tagWithGroups == m_groups.end()) {
    return;
  }
  if (num <= 0) {
    return;
  }
  std::vector<FieldMap *> &groups = tagWithGroups->second;
  if (groups.size() < static_cast<unsigned>(num)) {
    return;
  }

  std::vector<FieldMap *>::iterator group = groups.begin();
  std::advance(group, (num - 1));

  delete (*group);
  groups.erase(group);

  if (groups.size() == 0) {
    m_groups.erase(tagWithGroups);
    removeField(tag);
  } else {
    IntField groupCount(tag, (int)groups.size());
    setField(groupCount);
  }
}